

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

string * tinyobj::JoinPath(string *__return_storage_ptr__,string *dir,string *filename)

{
  string *__lhs;
  ulong uVar1;
  reference pcVar2;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [15];
  char local_21;
  string *psStack_20;
  char lastChar;
  string *filename_local;
  string *dir_local;
  
  psStack_20 = filename;
  filename_local = dir;
  dir_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::rbegin();
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(local_30);
    __lhs = filename_local;
    local_21 = *pcVar2;
    if (local_21 == '/') {
      std::operator+(__return_storage_ptr__,filename_local,psStack_20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"/",&local_71);
      std::operator+(&local_50,__lhs,&local_70);
      std::operator+(__return_storage_ptr__,&local_50,psStack_20);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string JoinPath(const std::string &dir,
                            const std::string &filename) {
  if (dir.empty()) {
    return filename;
  } else {
    // check '/'
    char lastChar = *dir.rbegin();
    if (lastChar != '/') {
      return dir + std::string("/") + filename;
    } else {
      return dir + filename;
    }
  }
}